

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

TestSuite * __thiscall testing::UnitTest::GetMutableTestSuite(UnitTest *this,int i)

{
  TestSuite *pTVar1;
  
  pTVar1 = internal::UnitTestImpl::GetMutableSuiteCase(this->impl_,i);
  return pTVar1;
}

Assistant:

TestSuite* UnitTest::GetMutableTestSuite(int i) {
  return impl()->GetMutableSuiteCase(i);
}